

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O2

void __thiscall
cs::struct_builder::struct_builder
          (struct_builder *this,context_t *c,string *name,tree_type<cs::token_base_*> *parent,
          deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *method)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  size_t sVar3;
  
  (this->mContext).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->mContext).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->mContext).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  (c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0
  ;
  sVar3 = mCount + 1;
  mCount = sVar3;
  (this->mTypeId).type_idx._M_target = (type_info *)&structure::typeinfo;
  (this->mTypeId).type_hash = sVar3;
  std::__cxx11::string::string((string *)&this->mName,(string *)name);
  (this->mParent).mRoot = (tree_node *)0x0;
  (this->mParent).mRoot = parent->mRoot;
  parent->mRoot = (tree_node *)0x0;
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::_Deque_base
            (&(this->mMethod).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>,
             &method->super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>
            );
  return;
}

Assistant:

struct_builder(context_t c, std::string name, tree_type<token_base *> parent,
		               std::deque<statement_base *> method) : mContext(std::move(c)),
			mTypeId(typeid(structure), ++mCount),
			mName(std::move(name)),
			mParent(std::move(parent)),
			mMethod(std::move(method)) {}